

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDA.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
PDA::getCFGVariables_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,PDA *this)

{
  pointer ppSVar1;
  State *__rhs;
  pointer ppSVar2;
  State *__rhs_00;
  pointer pbVar3;
  bool bVar4;
  pointer ppSVar5;
  pointer ppSVar6;
  pointer pbVar7;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string inputX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string variableName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&inputX,"S",(allocator<char> *)&variableName);
  __l._M_len = 1;
  __l._M_array = &inputX;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__,__l,(allocator_type *)&local_a8);
  std::__cxx11::string::~string((string *)&inputX);
  ppSVar1 = (this->statesQ).super__Vector_base<State_*,_std::allocator<State_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppSVar5 = (this->statesQ).super__Vector_base<State_*,_std::allocator<State_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppSVar5 != ppSVar1; ppSVar5 = ppSVar5 + 1) {
    __rhs = *ppSVar5;
    ppSVar2 = (this->statesQ).super__Vector_base<State_*,_std::allocator<State_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppSVar6 = (this->statesQ).super__Vector_base<State_*,_std::allocator<State_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppSVar6 != ppSVar2; ppSVar6 = ppSVar6 + 1) {
      __rhs_00 = *ppSVar6;
      pbVar3 = (this->stackAlphabetG).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar7 = (this->stackAlphabetG).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar3; pbVar7 = pbVar7 + 1
          ) {
        std::__cxx11::string::string((string *)&inputX,(string *)pbVar7);
        std::operator+(&local_e8,"[",&__rhs->name);
        std::operator+(&local_c8,&local_e8,&inputX);
        std::operator+(&local_a8,&local_c8,&__rhs_00->name);
        std::operator+(&variableName,&local_a8,"]");
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_e8);
        std::__cxx11::string::string((string *)&local_50,(string *)&variableName);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_68,__return_storage_ptr__);
        bVar4 = inVector(&local_50,&local_68);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_68);
        std::__cxx11::string::~string((string *)&local_50);
        if (!bVar4) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,&variableName);
        }
        std::__cxx11::string::~string((string *)&variableName);
        std::__cxx11::string::~string((string *)&inputX);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> PDA::getCFGVariables() {

    std::vector<std::string> variables = {"S"};

    for (State* stateP: statesQ){
        for (State* stateQ: statesQ){
            for(std::string inputX: stackAlphabetG){ // TODO: Check whether stackAlphabetG contains all elements  of the alphabet
                std::string variableName = "[" + stateP->getName() + inputX + stateQ->getName() + "]";
                if(!inVector(variableName, variables)){
                    variables.emplace_back(variableName);
                }
            }
        }
    }

    return variables;
}